

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O2

void __thiscall bloaty::anon_func::FilenameMap::~FilenameMap(FilenameMap *this)

{
  std::__cxx11::string::~string((string *)&this->missing_);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->map_)._M_h);
  dwarf::InfoReader::~InfoReader(&this->info_reader_);
  return;
}

Assistant:

FilenameMap(const dwarf::File& file)
        : info_reader_(file),
          missing_("[DWARF is missing filename]") {}